

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Sector_SetCeilingScale2
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  FSectorTagIterator itr;
  
  dVar2 = (double)arg1 * 1.52587890625e-05;
  dVar3 = (double)arg2 * 1.52587890625e-05;
  if (arg0 == 0) {
    itr.start = 0;
  }
  else {
    itr.start = tagManager.TagHashFirst[(ulong)(uint)arg0 & 0xff];
  }
  itr.searchtag = arg0;
  while( true ) {
    uVar1 = FSectorTagIterator::Next(&itr);
    if ((int)uVar1 < 0) break;
    if (arg1 != 0) {
      sectors[uVar1].planes[1].xform.xScale =
           (double)(~-(ulong)(dVar2 != 0.0) & (ulong)dVar2 |
                   (ulong)(1.0 / dVar2) & -(ulong)(dVar2 != 0.0));
    }
    if (arg2 != 0) {
      sectors[uVar1].planes[1].xform.yScale =
           (double)(~-(ulong)(dVar3 != 0.0) & (ulong)dVar3 |
                   (ulong)(1.0 / dVar3) & -(ulong)(dVar3 != 0.0));
    }
  }
  return 1;
}

Assistant:

FUNC(LS_Sector_SetCeilingScale2)
// Sector_SetFloorScale2 (tag, x-factor, y-factor)
{
	double xscale = arg1 / 65536., yscale = arg2 / 65536.;

	if (xscale)
		xscale = 1. / xscale;
	if (yscale)
		yscale = 1. / yscale;

	FSectorTagIterator itr(arg0);
	int secnum;
	while ((secnum = itr.Next()) >= 0)
	{
		if (arg1)
			sectors[secnum].SetXScale(sector_t::ceiling, xscale);
		if (arg2)
			sectors[secnum].SetYScale(sector_t::ceiling, yscale);
	}
	return true;
}